

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.hpp
# Opt level: O1

void __thiscall
duckdb::CatalogSetSecretStorage::~CatalogSetSecretStorage(CatalogSetSecretStorage *this)

{
  pointer pcVar1;
  
  (this->super_SecretStorage)._vptr_SecretStorage =
       (_func_int **)&PTR__CatalogSetSecretStorage_019a0aa0;
  ::std::unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::~unique_ptr
            (&(this->secrets).
              super_unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>);
  (this->super_SecretStorage)._vptr_SecretStorage = (_func_int **)&PTR__SecretStorage_019a0cb8;
  pcVar1 = (this->super_SecretStorage).storage_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SecretStorage).storage_name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

CatalogSetSecretStorage(DatabaseInstance &db_instance, const string &name_p, const int64_t offset)
	    : SecretStorage(name_p, offset), db(db_instance) {}